

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DPIImportSyntax::setChild(DPIImportSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b7904 + *(int *)(&DAT_015b7904 + in_RSI * 4)))();
  return;
}

Assistant:

void DPIImportSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: specString = child.token(); return;
        case 3: property = child.token(); return;
        case 4: c_identifier = child.token(); return;
        case 5: equals = child.token(); return;
        case 6: method = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        case 7: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}